

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QDateTime __thiscall
QLocale::toDateTime(QLocale *this,QString *string,FormatType format,QCalendar cal,int baseYear)

{
  long lVar1;
  int in_ECX;
  QString *in_RDX;
  QString *in_RSI;
  Data in_RDI;
  long in_FS_OFFSET;
  QCalendar in_stack_00000098;
  Data this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  dateTimeFormat((QLocale *)in_RSI,(FormatType)((ulong)in_RDX >> 0x20));
  toDateTime((QLocale *)this_00.d,in_RSI,in_RDX,in_stack_00000098,in_ECX);
  QString::~QString((QString *)0x4cfc7c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDateTime)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QLocale::toDateTime(const QString &string, FormatType format, QCalendar cal,
                              int baseYear) const
{
    return toDateTime(string, dateTimeFormat(format), cal, baseYear);
}